

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * getTypedProperty<std::__cxx11::string>
                   (string *__return_storage_ptr__,cmGeneratorTarget *tgt,string *prop,
                   cmGeneratorExpressionInterpreter *genexInterpreter)

{
  cmValue value;
  string *psVar1;
  allocator<char> local_41;
  string local_40;
  
  value = cmGeneratorTarget::GetProperty(tgt,prop);
  if (genexInterpreter == (cmGeneratorExpressionInterpreter *)0x0) {
    valueAsString<cmValue>(__return_storage_ptr__,value);
  }
  else {
    if (value.Value == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
    }
    else {
      std::__cxx11::string::string((string *)&local_40,(string *)value.Value);
    }
    psVar1 = cmGeneratorExpressionInterpreter::Evaluate(genexInterpreter,&local_40,prop);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getTypedProperty<std::string>(
  cmGeneratorTarget const* tgt, const std::string& prop,
  cmGeneratorExpressionInterpreter* genexInterpreter)
{
  cmValue value = tgt->GetProperty(prop);

  if (genexInterpreter == nullptr) {
    return valueAsString(value);
  }

  return genexInterpreter->Evaluate(value ? *value : "", prop);
}